

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

string * __thiscall
trun::ResultsReportJSON::EscapeString
          (string *__return_storage_ptr__,ResultsReportJSON *this,string *str)

{
  char __c;
  undefined8 this_00;
  bool bVar1;
  reference pcVar2;
  size_type sVar3;
  const_iterator cStack_70;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string strIllegal;
  string *str_local;
  ResultsReportJSON *this_local;
  string *strEscaped;
  
  strIllegal.field_2._8_8_ = str;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"\"\\",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this_00 = strIllegal.field_2._8_8_;
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      strIllegal.field_2._8_8_);
  cStack_70 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,&stack0xffffffffffffff90), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    __c = *pcVar2;
    if ('\x1e' < __c) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40,__c,0);
      if (sVar3 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,'\\');
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,__c);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultsReportJSON::EscapeString(const std::string &str) {
    std::string strIllegal = "\"\\";
    std::string strEscaped;
    for(auto c : str) {
        // Just skip this - we do not forward tab's, bells, new lines and whatever...
        if (c < 31) continue;
        if (strIllegal.find(c) != std::string::npos) {
            strEscaped += '\\';
        }
        strEscaped += c;
    }

    return strEscaped;
}